

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void show_seg_usage(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uchar (*pauVar6) [8192];
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int local_38;
  
  uVar9 = machine->ram_base;
  puts("segment usage:");
  putchar(10);
  if (max_bank != 0) {
    puts("\t\t\t\t    USED/FREE");
  }
  if (max_zp < 2) {
    puts("      ZP    -");
  }
  else {
    printf("      ZP    $%04X-$%04X  [%4i]     %4i/%4i\n",(ulong)uVar9,(ulong)((uVar9 + max_zp) - 1)
           ,(ulong)(uint)max_zp,(ulong)(uint)max_zp,(ulong)(0x100 - max_zp));
  }
  if (max_bss < 0x202) {
    puts("     BSS    -");
  }
  else {
    printf("     BSS    $%04X-$%04X  [%4i]     %4i/%4i\n\n");
  }
  if (max_bank < 0) {
    uVar10 = 0;
    uVar9 = 0;
  }
  else {
    lVar7 = 0;
    pauVar6 = map;
    local_38 = 0;
    iVar3 = 0;
    lVar8 = 0;
    do {
      lVar4 = 0;
      uVar9 = 0;
      do {
        uVar9 = uVar9 + ((*pauVar6)[lVar4] != 0xff);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x2000);
      if (uVar9 == 0) {
        printf("BANK %2X  %-23s       0/8192\n",lVar8,bank_name + lVar8);
      }
      else {
        printf("BANK %2X  %-23s    %4i/%4i\n",lVar8,bank_name + lVar8,(ulong)uVar9,
               (ulong)(0x2000 - uVar9));
        if (dump_seg != 1) {
          uVar5 = 0;
          do {
            if ((int)uVar5 < 0x2000) {
              uVar5 = (ulong)(int)uVar5;
              do {
                if (map[0][uVar5 + lVar7] != 0xff) goto LAB_0010ed97;
                uVar5 = uVar5 + 1;
              } while (uVar5 != 0x2000);
              uVar5 = 0x2000;
            }
LAB_0010ed97:
            iVar2 = (int)uVar5;
            if (0x1fff < iVar2) break;
            uVar5 = (ulong)iVar2;
            section = map[lVar8][uVar5] & 0xf;
            page = (map[lVar8][uVar5] & 0xffffffe0) * 0x100;
            do {
              if ((byte)section != (map[0][uVar5 + lVar7] & 0xf)) goto LAB_0010edee;
              uVar5 = uVar5 + 1;
            } while (uVar5 != 0x2000);
            uVar5 = 0x2000;
LAB_0010edee:
            printf("    %s    $%04X-$%04X  [%4i]\n",section_name + (uint)section,
                   (ulong)(uint)(page + iVar2),(ulong)((page + (int)uVar5) - 1),
                   (ulong)(uint)((int)uVar5 - iVar2));
            uVar5 = uVar5 & 0xffffffff;
          } while( true );
        }
      }
      iVar3 = iVar3 + uVar9;
      local_38 = local_38 + (0x2000 - uVar9);
      pauVar6 = pauVar6 + 1;
      lVar7 = lVar7 + 0x2000;
      bVar1 = lVar8 < max_bank;
      lVar8 = lVar8 + 1;
    } while (bVar1);
    uVar10 = iVar3 + 0x3ffU >> 10;
    uVar9 = local_38 >> 10;
  }
  puts("\t\t\t\t    ---- ----");
  printf("\t\t\t\t    %4iK%4iK\n",(ulong)uVar10,(ulong)uVar9);
  printf("\n\t\t\tTOTAL SIZE =     %4iK\n",(ulong)(uVar10 + uVar9));
  return;
}

Assistant:

void
show_seg_usage(void)
{
	int i, j;
	int addr, start, stop, nb;
	int rom_used;
	int rom_free;
	int ram_base = machine->ram_base;

	printf("segment usage:\n");
	printf("\n");

	if (max_bank)
		printf("\t\t\t\t    USED/FREE\n");

	/* zp usage */
	if (max_zp <= 1)
		printf("      ZP    -\n");
	else {
		start = ram_base;
		stop  = ram_base + (max_zp - 1);
		printf("      ZP    $%04X-$%04X  [%4i]     %4i/%4i\n", start, stop, stop - start + 1, stop-start+1, 256-(stop-start+1));
	}

	/* bss usage */
	if (max_bss <= 0x201)
		printf("     BSS    -\n");
	else {
		start = ram_base + 0x200;
		stop  = ram_base + (max_bss - 1);
		printf("     BSS    $%04X-$%04X  [%4i]     %4i/%4i\n\n", start, stop, stop - start + 1, stop-start+1, 8192-(stop-start+1));
	}

	/* bank usage */
	rom_used = 0;
	rom_free = 0;

	/* scan banks */
	for (i = 0; i <= max_bank; i++) {
		start = 0;
		addr = 0;
		nb = 0;

		/* count used and free bytes */
		for (j = 0; j < 8192; j++)
			if (map[i][j] != 0xFF)
				nb++;

		/* update used/free counters */
		rom_used += nb;
		rom_free += 8192 - nb;

		/* display bank infos */
		if (nb)
			printf("BANK %2X  %-23s    %4i/%4i\n",
					i, bank_name[i], nb, 8192 - nb);
		else {
			printf("BANK %2X  %-23s       0/8192\n", i, bank_name[i]);
			continue;
		}

		/* scan */
		if (dump_seg == 1)
			continue;

		for (;;) {
			/* search section start */
			for (; addr < 8192; addr++)
				if (map[i][addr] != 0xFF)
					break;

			/* check for end of bank */
			if (addr > 8191)
				break;

			/* get section type */
			section = map[i][addr] & 0x0F;
			page = (map[i][addr] & 0xE0) << 8;
			start = addr;

			/* search section end */
			for (; addr < 8192; addr++)
				if ((map[i][addr] & 0x0F) != section)
					break;

			/* display section infos */
			printf("    %s    $%04X-$%04X  [%4i]\n",
					section_name[section],	/* section name */
				    start + page,			/* starting address */
					addr  + page - 1,		/* end address */
					addr  - start);			/* size */
		}
	}

	/* total */
	rom_used = (rom_used + 1023) >> 10;
	rom_free = (rom_free) >> 10;
	printf("\t\t\t\t    ---- ----\n");
	printf("\t\t\t\t    %4iK%4iK\n", rom_used, rom_free);
	printf("\n\t\t\tTOTAL SIZE =     %4iK\n", (rom_used + rom_free));
}